

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void __thiscall QApplication::setStyleSheet(QApplication *this,QString *styleSheet)

{
  QStyleSheetStyle *pQVar1;
  
  QString::operator=(&QApplicationPrivate::styleSheet,(QString *)styleSheet);
  pQVar1 = (QStyleSheetStyle *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if ((styleSheet->d).size == 0) {
    if (pQVar1 == (QStyleSheetStyle *)0x0) {
      return;
    }
    pQVar1 = *(QStyleSheetStyle **)(pQVar1 + 0x10);
  }
  else {
    if (pQVar1 != (QStyleSheetStyle *)0x0) {
      QStyleSheetStyle::repolish(pQVar1,QCoreApplication::self);
      return;
    }
    pQVar1 = (QStyleSheetStyle *)operator_new(0x60);
    QStyleSheetStyle::QStyleSheetStyle(pQVar1,QApplicationPrivate::app_style);
    QObject::setParent(&QApplicationPrivate::app_style->super_QObject);
  }
  setStyle((QStyle *)pQVar1);
  return;
}

Assistant:

void QApplication::setStyleSheet(const QString& styleSheet)
{
    QApplicationPrivate::styleSheet = styleSheet;
    QStyleSheetStyle *styleSheetStyle = qt_styleSheet(QApplicationPrivate::app_style);
    if (styleSheet.isEmpty()) { // application style sheet removed
        if (!styleSheetStyle)
            return; // there was no stylesheet before
        setStyle(styleSheetStyle->base);
    } else if (styleSheetStyle) { // style sheet update, just repolish
        styleSheetStyle->repolish(qApp);
    } else { // stylesheet set the first time
        QStyleSheetStyle *newStyleSheetStyle = new QStyleSheetStyle(QApplicationPrivate::app_style);
        QApplicationPrivate::app_style->setParent(newStyleSheetStyle);
        setStyle(newStyleSheetStyle);
    }
}